

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

void aom_noise_strength_solver_add_measurement
               (aom_noise_strength_solver_t *solver,double block_mean,double noise_std)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = solver->min_intensity;
  dVar7 = solver->max_intensity;
  dVar8 = dVar7;
  if (block_mean <= dVar7) {
    dVar8 = block_mean;
  }
  iVar5 = solver->num_bins;
  dVar6 = (((double)(-(ulong)(block_mean < dVar6) & (ulong)dVar6 |
                    ~-(ulong)(block_mean < dVar6) & (ulong)dVar8) - dVar6) * (double)(iVar5 + -1)) /
          (dVar7 - dVar6);
  dVar7 = floor(dVar6);
  iVar3 = (int)dVar7;
  iVar1 = iVar5 + -1;
  if (iVar3 + 1 < iVar5) {
    iVar1 = iVar3 + 1;
  }
  dVar6 = dVar6 - (double)(int)dVar7;
  dVar7 = 1.0 - dVar6;
  pdVar2 = (solver->eqns).A;
  iVar4 = iVar5 * iVar3 + iVar3;
  pdVar2[iVar4] = dVar7 * dVar7 + pdVar2[iVar4];
  iVar4 = iVar1 * iVar5 + iVar3;
  pdVar2[iVar4] = pdVar2[iVar4] + dVar6 * dVar7;
  iVar4 = iVar1 * iVar5 + iVar1;
  pdVar2[iVar4] = dVar6 * dVar6 + pdVar2[iVar4];
  iVar5 = iVar5 * iVar3 + iVar1;
  pdVar2[iVar5] = dVar6 * dVar7 + pdVar2[iVar5];
  pdVar2 = (solver->eqns).b;
  pdVar2[iVar3] = dVar7 * noise_std + pdVar2[iVar3];
  pdVar2[iVar1] = dVar6 * noise_std + pdVar2[iVar1];
  solver->total = noise_std + solver->total;
  solver->num_equations = solver->num_equations + 1;
  return;
}

Assistant:

void aom_noise_strength_solver_add_measurement(
    aom_noise_strength_solver_t *solver, double block_mean, double noise_std) {
  const double bin = noise_strength_solver_get_bin_index(solver, block_mean);
  const int bin_i0 = (int)floor(bin);
  const int bin_i1 = AOMMIN(solver->num_bins - 1, bin_i0 + 1);
  const double a = bin - bin_i0;
  const int n = solver->num_bins;
  solver->eqns.A[bin_i0 * n + bin_i0] += (1.0 - a) * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i0] += a * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i1] += a * a;
  solver->eqns.A[bin_i0 * n + bin_i1] += a * (1.0 - a);
  solver->eqns.b[bin_i0] += (1.0 - a) * noise_std;
  solver->eqns.b[bin_i1] += a * noise_std;
  solver->total += noise_std;
  solver->num_equations++;
}